

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void compareComponent(ComponentPtr *c1,ComponentPtr *c2,EntityPtr *expectedParent)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> lhs;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  ulong uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  AssertionResult local_458 [2];
  AssertHelper local_438 [8];
  Message local_430 [8];
  shared_ptr<libcellml::Variable> local_428;
  bool local_411;
  undefined1 local_410 [8];
  AssertionResult gtest_ar__1;
  AssertionResult local_3f0 [2];
  AssertHelper local_3d0 [8];
  Message local_3c8 [8];
  shared_ptr<libcellml::Variable> local_3c0;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_388 [8];
  ResetPtr r;
  size_t index_1;
  undefined1 local_360 [8];
  ComponentPtr c2i;
  ComponentPtr c1i;
  size_t index;
  Message local_330 [8];
  shared_ptr<libcellml::ParentedEntity> local_328;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_9;
  Message local_300 [8];
  unsigned_long local_2f8;
  unsigned_long local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_8;
  Message local_2d0 [8];
  unsigned_long local_2c8;
  unsigned_long local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_7;
  Message local_2a0 [8];
  unsigned_long local_298;
  unsigned_long local_290;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_6;
  Message local_270 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_5;
  Message local_210 [8];
  shared_ptr<libcellml::ImportSource> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  shared_ptr<libcellml::ImportSource> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_4;
  Message local_190 [8];
  shared_ptr<libcellml::ImportSource> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  shared_ptr<libcellml::ImportSource> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110 [14];
  bool local_102;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  Message local_88 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  EntityPtr *expectedParent_local;
  ComponentPtr *c2_local;
  ComponentPtr *c1_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expectedParent;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c1);
  libcellml::NamedEntity::name_abi_cxx11_();
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c2);
  libcellml::NamedEntity::name_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_30,"c1->name()","c2->name()",&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_88);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x162,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c1);
  libcellml::Entity::id_abi_cxx11_();
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c2);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_a0,"c1->id()","c2->id()",&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x163,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c1);
  local_101 = (bool)libcellml::ImportedEntity::isImport();
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c2);
  local_102 = (bool)libcellml::ImportedEntity::isImport();
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_100,"c1->isImport()","c2->isImport()",&local_101,&local_102);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x164,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c1);
  uVar5 = libcellml::ImportedEntity::isImport();
  if ((uVar5 & 1) != 0) {
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c2);
    uVar5 = libcellml::ImportedEntity::isImport();
    if ((uVar5 & 1) != 0) {
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c1);
      libcellml::ImportedEntity::importSource();
      std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_158);
      libcellml::ImportSource::url_abi_cxx11_();
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c2);
      libcellml::ImportedEntity::importSource();
      std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_188);
      libcellml::ImportSource::url_abi_cxx11_();
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_128,"c1->importSource()->url()",
                 "c2->importSource()->url()",&local_148,&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_188);
      std::__cxx11::string::~string((string *)&local_148);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_158);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar2) {
        testing::Message::Message(local_190);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x166,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_190);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(local_190);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c1);
      libcellml::ImportedEntity::importSource();
      std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_1d8);
      libcellml::Entity::id_abi_cxx11_();
      std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)c2);
      libcellml::ImportedEntity::importSource();
      std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_208);
      libcellml::Entity::id_abi_cxx11_();
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
                ((EqHelper<false> *)local_1a8,"c1->importSource()->id()","c2->importSource()->id()",
                 &local_1c8,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_208);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::shared_ptr<libcellml::ImportSource>::~shared_ptr(&local_1d8);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
      if (!bVar2) {
        testing::Message::Message(local_210);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x167,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_210);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(local_210);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    }
  }
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c1);
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c2);
  libcellml::ImportedEntity::importReference_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_228,"c1->importReference()","c2->importReference()",&local_248
             ,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(local_270);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x169,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c1);
  local_290 = libcellml::ComponentEntity::componentCount();
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c2);
  local_298 = libcellml::ComponentEntity::componentCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_288,"c1->componentCount()","c2->componentCount()",&local_290,
             &local_298);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar2) {
    testing::Message::Message(local_2a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x16a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c1);
  local_2c0 = libcellml::Component::resetCount();
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c2);
  local_2c8 = libcellml::Component::resetCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2b8,"c1->resetCount()","c2->resetCount()",&local_2c0,
             &local_2c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar2) {
    testing::Message::Message(local_2d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x16b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c1);
  local_2f0 = libcellml::Component::variableCount();
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c2);
  local_2f8 = libcellml::Component::variableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2e8,"c1->variableCount()","c2->variableCount()",&local_2f0,
             &local_2f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar2) {
    testing::Message::Message(local_300);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x16c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  lhs = gtest_ar.message_;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             c2);
  libcellml::ParentedEntity::parent();
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Entity>,std::shared_ptr<libcellml::ParentedEntity>>
            ((EqHelper<false> *)local_318,"expectedParent","c2->parent()",
             (shared_ptr<libcellml::Entity> *)lhs.ptr_,&local_328);
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_328);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar2) {
    testing::Message::Message(local_330);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&index,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
               ,0x16e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&index,local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&index);
    testing::Message::~Message(local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  c1i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c1);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             libcellml::ComponentEntity::componentCount();
    if (p_Var6 <= c1i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi) break;
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c1);
    libcellml::ComponentEntity::component
              ((ulong)&c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c2);
    libcellml::ComponentEntity::component((ulong)local_360);
    std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Component,void>
              ((shared_ptr<libcellml::Entity> *)&index_1,c2);
    compareComponent((ComponentPtr *)
                     &c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(ComponentPtr *)local_360,
                     (shared_ptr<libcellml::Entity> *)&index_1);
    std::shared_ptr<libcellml::Entity>::~shared_ptr((shared_ptr<libcellml::Entity> *)&index_1);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)local_360);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)
               &c2i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    c1i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         c1i.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         + 1;
  }
  r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c2);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)libcellml::Component::resetCount();
    if (p_Var6 <= _Var1._M_pi) break;
    std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)c2);
    libcellml::Component::reset((ulong)local_388);
    std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_388);
    libcellml::Reset::variable();
    bVar2 = std::operator!=((shared_ptr<libcellml::Variable> *)&gtest_ar_.message_,(nullptr_t)0x0);
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)&gtest_ar_.message_);
    if (bVar2) {
      peVar7 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)c2);
      std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_388);
      libcellml::Reset::variable();
      bVar3 = libcellml::Component::hasVariable((shared_ptr *)peVar7);
      local_3a9 = (bool)(bVar3 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
      std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_3c0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
      if (!bVar2) {
        testing::Message::Message(local_3c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_3f0,local_3a8,"c2->hasVariable(r->variable())","false");
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_3d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x178,pcVar4);
        testing::internal::AssertHelper::operator=(local_3d0,local_3c8);
        testing::internal::AssertHelper::~AssertHelper(local_3d0);
        std::__cxx11::string::~string((string *)local_3f0);
        testing::Message::~Message(local_3c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    }
    std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_388);
    libcellml::Reset::testVariable();
    bVar2 = std::operator!=((shared_ptr<libcellml::Variable> *)&gtest_ar__1.message_,(nullptr_t)0x0)
    ;
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)&gtest_ar__1.message_);
    if (bVar2) {
      peVar7 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)c2);
      std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_388);
      libcellml::Reset::testVariable();
      bVar3 = libcellml::Component::hasVariable((shared_ptr *)peVar7);
      local_411 = (bool)(bVar3 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_410,&local_411,(type *)0x0);
      std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_428);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
      if (!bVar2) {
        testing::Message::Message(local_430);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_458,local_410,"c2->hasVariable(r->testVariable())","false");
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_438,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/test_utils.cpp"
                   ,0x17b,pcVar4);
        testing::internal::AssertHelper::operator=(local_438,local_430);
        testing::internal::AssertHelper::~AssertHelper(local_438);
        std::__cxx11::string::~string((string *)local_458);
        testing::Message::~Message(local_430);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
    }
    std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_388);
    r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         r.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1;
  }
  return;
}

Assistant:

void compareComponent(const libcellml::ComponentPtr &c1, const libcellml::ComponentPtr &c2, const libcellml::EntityPtr &expectedParent)
{
    EXPECT_EQ(c1->name(), c2->name());
    EXPECT_EQ(c1->id(), c2->id());
    EXPECT_EQ(c1->isImport(), c2->isImport());
    if (c1->isImport() && c2->isImport()) {
        EXPECT_EQ(c1->importSource()->url(), c2->importSource()->url());
        EXPECT_EQ(c1->importSource()->id(), c2->importSource()->id());
    }
    EXPECT_EQ(c1->importReference(), c2->importReference());
    EXPECT_EQ(c1->componentCount(), c2->componentCount());
    EXPECT_EQ(c1->resetCount(), c2->resetCount());
    EXPECT_EQ(c1->variableCount(), c2->variableCount());

    EXPECT_EQ(expectedParent, c2->parent());

    for (size_t index = 0; index < c1->componentCount(); ++index) {
        auto c1i = c1->component(index);
        auto c2i = c2->component(index);
        compareComponent(c1i, c2i, c2);
    }
    for (size_t index = 0; index < c2->resetCount(); ++index) {
        auto r = c2->reset(index);
        if (r->variable() != nullptr) {
            EXPECT_TRUE(c2->hasVariable(r->variable()));
        }
        if (r->testVariable() != nullptr) {
            EXPECT_TRUE(c2->hasVariable(r->testVariable()));
        }
    }
}